

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

int trico_write_attributes_uint8(void *a,uint8_t *attrib,uint32_t nr_of_attribs)

{
  ssize_t sVar1;
  char *dst;
  int iVar2;
  uint uVar3;
  uint8_t header;
  uint32_t nr_of_attribs_local;
  uint32_t bytes_written;
  LZ4_stream_t lz4Stream_body;
  
  header = '\x11';
  nr_of_attribs_local = nr_of_attribs;
  sVar1 = write((int)&header,(void *)0x1,1);
  iVar2 = 0;
  if ((int)sVar1 != 0) {
    sVar1 = write((int)&nr_of_attribs_local,(void *)0x4,1);
    if ((int)sVar1 != 0) {
      LZ4_initStream(&lz4Stream_body,0x4020);
      iVar2 = 0;
      uVar3 = 0;
      if (nr_of_attribs < 0x7e000001) {
        uVar3 = nr_of_attribs + nr_of_attribs / 0xff + 0x10;
      }
      dst = (char *)malloc((ulong)uVar3);
      uVar3 = LZ4_compress_default((char *)attrib,dst,nr_of_attribs,uVar3);
      bytes_written = uVar3;
      sVar1 = write((int)&bytes_written,(void *)0x4,1);
      if ((int)sVar1 != 0) {
        sVar1 = write((int)dst,(void *)0x1,(ulong)uVar3);
        if ((int)sVar1 != 0) {
          free(dst);
          iVar2 = 1;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int trico_write_attributes_uint8(void* a, const uint8_t* attrib, uint32_t nr_of_attribs)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)trico_attribute_uint8_stream;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0; 

  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  unsigned estimateLen = LZ4_COMPRESSBOUND(nr_of_attribs);
  uint8_t* compressed_buf = (uint8_t*)trico_malloc(estimateLen);

  uint32_t bytes_written = (uint32_t)LZ4_compress_default((const char*)attrib, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  trico_free(compressed_buf);

  return 1;
  }